

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::
addAll<capnp::(anonymous_namespace)::CppTypeName*,false>
          (ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *this,CppTypeName *start,
          CppTypeName *end)

{
  CppTypeName *this_00;
  ExceptionGuard local_30;
  
  this_00 = this->pos;
  local_30.start = this_00;
  for (; start != end; start = start + 1) {
    capnp::anon_unknown_1::CppTypeName::CppTypeName(this_00,start);
    this_00 = this_00 + 1;
  }
  local_30.start = this_00;
  local_30.pos = this_00;
  _::
  CopyConstructArray_<capnp::(anonymous_namespace)::CppTypeName,_capnp::(anonymous_namespace)::CppTypeName_*,_false,_false>
  ::ExceptionGuard::~ExceptionGuard(&local_30);
  this->pos = this_00;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}